

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O0

CMNode * __thiscall
xercesc_4_0::DFAContentModel::buildSyntaxTree
          (DFAContentModel *this,ContentSpecNode *curNode,uint *curIndex)

{
  NodeTypes NVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  NodeTypes NVar5;
  QName *pQVar6;
  CMLeaf *pCVar7;
  QName *this_00;
  ContentSpecNode *pCVar8;
  CMRepeatingLeaf *this_01;
  ContentSpecNode *curNode_00;
  ContentSpecNode *pCVar9;
  CMNode *pCVar10;
  CMStateSet *pCVar11;
  CMBinaryOp *this_02;
  CMNode *this_03;
  RuntimeException *this_04;
  bool bVar12;
  OutOfMemoryException *anon_var_0;
  XMLSize_t index_2;
  CMStateSetEnumerator enumLast_2;
  CMStateSet *last_2;
  CMStateSet *first_2;
  CMNode *newChild;
  OutOfMemoryException *anon_var_0_4;
  XMLSize_t index_1;
  CMStateSetEnumerator enumLast_1;
  CMStateSet *first_1;
  CMStateSet *last_1;
  OutOfMemoryException *anon_var_0_3;
  CMNode *newRight_1;
  CMNode *newLeft;
  OutOfMemoryException *anon_var_0_2;
  XMLSize_t index;
  CMStateSetEnumerator enumLast;
  CMStateSet *first;
  CMStateSet *last;
  CMNode *newRight;
  ContentSpecNode *pCStack_70;
  uint i;
  ContentSpecNode *cursor;
  uint nLoopCount;
  ContentSpecNode *rightNode;
  ContentSpecNode *leftNode;
  OutOfMemoryException *anon_var_0_1;
  CMRepeatingLeaf *pCStack_30;
  NodeTypes curType;
  CMNode *retNode;
  uint *curIndex_local;
  ContentSpecNode *curNode_local;
  DFAContentModel *this_local;
  
  NVar1 = ContentSpecNode::getType(curNode);
  if ((((NVar1 & (Any_NS|Any_Other)) == Any) || ((NVar1 & (Any_NS|Any_Other)) == Any_Other)) ||
     ((NVar1 & (Any_NS|Any_Other)) == Any_NS)) {
    pCStack_30 = (CMRepeatingLeaf *)XMemory::operator_new(0x38,this->fMemoryManager);
    pQVar6 = ContentSpecNode::getElement(curNode);
    uVar2 = QName::getURI(pQVar6);
    CMAny::CMAny((CMAny *)pCStack_30,NVar1,uVar2,*curIndex,this->fLeafCount,this->fMemoryManager);
    pCVar7 = (CMLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    pQVar6 = (QName *)XMemory::operator_new(0x48,this->fMemoryManager);
    this_00 = ContentSpecNode::getElement(curNode);
    uVar2 = QName::getURI(this_00);
    QName::QName(pQVar6,L"",L"",uVar2,this->fMemoryManager);
    CMLeaf::CMLeaf(pCVar7,pQVar6,*curIndex,true,this->fLeafCount,this->fMemoryManager);
    this->fLeafList[*curIndex] = pCVar7;
    this->fLeafListType[*curIndex] = NVar1;
    *curIndex = *curIndex + 1;
  }
  else if (NVar1 == Leaf) {
    pCStack_30 = (CMRepeatingLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    pQVar6 = ContentSpecNode::getElement(curNode);
    CMLeaf::CMLeaf((CMLeaf *)pCStack_30,pQVar6,*curIndex,this->fLeafCount,this->fMemoryManager);
    pCVar7 = (CMLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    pQVar6 = ContentSpecNode::getElement(curNode);
    CMLeaf::CMLeaf(pCVar7,pQVar6,*curIndex,this->fLeafCount,this->fMemoryManager);
    this->fLeafList[*curIndex] = pCVar7;
    this->fLeafListType[*curIndex] = Leaf;
    *curIndex = *curIndex + 1;
  }
  else if (NVar1 == Loop) {
    pCStack_30 = (CMRepeatingLeaf *)XMemory::operator_new(0x48,this->fMemoryManager);
    pCVar8 = ContentSpecNode::getFirst(curNode);
    pQVar6 = ContentSpecNode::getElement(pCVar8);
    iVar3 = ContentSpecNode::getMinOccurs(curNode);
    iVar4 = ContentSpecNode::getMaxOccurs(curNode);
    CMRepeatingLeaf::CMRepeatingLeaf
              (pCStack_30,pQVar6,iVar3,iVar4,*curIndex,this->fLeafCount,this->fMemoryManager);
    this_01 = (CMRepeatingLeaf *)XMemory::operator_new(0x48,this->fMemoryManager);
    pCVar8 = ContentSpecNode::getFirst(curNode);
    pQVar6 = ContentSpecNode::getElement(pCVar8);
    iVar3 = ContentSpecNode::getMinOccurs(curNode);
    iVar4 = ContentSpecNode::getMaxOccurs(curNode);
    CMRepeatingLeaf::CMRepeatingLeaf
              (this_01,pQVar6,iVar3,iVar4,*curIndex,this->fLeafCount,this->fMemoryManager);
    this->fLeafList[*curIndex] = (CMLeaf *)this_01;
    pCVar8 = ContentSpecNode::getFirst(curNode);
    NVar1 = ContentSpecNode::getType(pCVar8);
    this->fLeafListType[*curIndex] = NVar1;
    *curIndex = *curIndex + 1;
  }
  else {
    pCVar8 = ContentSpecNode::getFirst(curNode);
    curNode_00 = ContentSpecNode::getSecond(curNode);
    cursor._4_4_ = 0;
    pCStack_70 = curNode;
    while( true ) {
      NVar5 = ContentSpecNode::getType(pCStack_70);
      bVar12 = false;
      if (NVar5 == Sequence) {
        pCVar9 = ContentSpecNode::getFirst(pCStack_70);
        bVar12 = false;
        if (pCVar9 != (ContentSpecNode *)0x0) {
          pCVar9 = ContentSpecNode::getFirst(pCStack_70);
          pCVar9 = ContentSpecNode::getSecond(pCVar9);
          bVar12 = pCVar9 == curNode_00;
        }
      }
      if (!bVar12) break;
      cursor._4_4_ = cursor._4_4_ + 1;
      pCStack_70 = ContentSpecNode::getFirst(pCStack_70);
    }
    if (cursor._4_4_ != 0) {
      pCStack_30 = (CMRepeatingLeaf *)buildSyntaxTree(this,pCStack_70,curIndex);
      for (newRight._4_4_ = 0; newRight._4_4_ < cursor._4_4_; newRight._4_4_ = newRight._4_4_ + 1) {
        pCVar10 = buildSyntaxTree(this,curNode_00,curIndex);
        pCVar11 = CMNode::getLastPos((CMNode *)pCStack_30);
        enumLast._16_8_ = CMNode::getFirstPos(pCVar10);
        CMStateSetEnumerator::CMStateSetEnumerator((CMStateSetEnumerator *)&index,pCVar11,0);
        while (bVar12 = CMStateSetEnumerator::hasMoreElements((CMStateSetEnumerator *)&index),
              bVar12) {
          uVar2 = CMStateSetEnumerator::nextElement((CMStateSetEnumerator *)&index);
          CMStateSet::operator|=(this->fFollowList[uVar2],(CMStateSet *)enumLast._16_8_);
        }
        this_02 = (CMBinaryOp *)XMemory::operator_new(0x40,this->fMemoryManager);
        CMBinaryOp::CMBinaryOp
                  (this_02,Sequence,(CMNode *)pCStack_30,pCVar10,this->fLeafCount,
                   this->fMemoryManager);
        pCStack_30 = (CMRepeatingLeaf *)this_02;
      }
      return &((CMBinaryOp *)pCStack_30)->super_CMNode;
    }
    if (((NVar1 & (Any_NS|Any_Other)) == Choice) || ((NVar1 & (Any_NS|Any_Other)) == Sequence)) {
      pCVar10 = buildSyntaxTree(this,pCVar8,curIndex);
      this_03 = buildSyntaxTree(this,curNode_00,curIndex);
      if ((NVar1 & (Any_NS|Any_Other)) == Sequence) {
        pCVar11 = CMNode::getLastPos(pCVar10);
        enumLast_1._16_8_ = CMNode::getFirstPos(this_03);
        CMStateSetEnumerator::CMStateSetEnumerator((CMStateSetEnumerator *)&index_1,pCVar11,0);
        while (bVar12 = CMStateSetEnumerator::hasMoreElements((CMStateSetEnumerator *)&index_1),
              bVar12) {
          uVar2 = CMStateSetEnumerator::nextElement((CMStateSetEnumerator *)&index_1);
          CMStateSet::operator|=(this->fFollowList[uVar2],(CMStateSet *)enumLast_1._16_8_);
        }
      }
      pCStack_30 = (CMRepeatingLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
      CMBinaryOp::CMBinaryOp
                ((CMBinaryOp *)pCStack_30,NVar1,pCVar10,this_03,this->fLeafCount,
                 this->fMemoryManager);
    }
    else {
      if (((NVar1 != ZeroOrMore) && (NVar1 != ZeroOrOne)) && (NVar1 != OneOrMore)) {
        this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/DFAContentModel.cpp"
                   ,0x67d,CM_UnknownCMSpecType,this->fMemoryManager);
        __cxa_throw(this_04,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      pCVar10 = buildSyntaxTree(this,pCVar8,curIndex);
      if ((NVar1 == ZeroOrMore) || (NVar1 == OneOrMore)) {
        pCVar11 = CMNode::getFirstPos(pCVar10);
        enumLast_2._16_8_ = CMNode::getLastPos(pCVar10);
        CMStateSetEnumerator::CMStateSetEnumerator
                  ((CMStateSetEnumerator *)&index_2,(CMStateSet *)enumLast_2._16_8_,0);
        while (bVar12 = CMStateSetEnumerator::hasMoreElements((CMStateSetEnumerator *)&index_2),
              bVar12) {
          uVar2 = CMStateSetEnumerator::nextElement((CMStateSetEnumerator *)&index_2);
          CMStateSet::operator|=(this->fFollowList[uVar2],pCVar11);
        }
      }
      pCStack_30 = (CMRepeatingLeaf *)XMemory::operator_new(0x38,this->fMemoryManager);
      CMUnaryOp::CMUnaryOp
                ((CMUnaryOp *)pCStack_30,NVar1,pCVar10,this->fLeafCount,this->fMemoryManager);
    }
  }
  CMNode::getFirstPos((CMNode *)pCStack_30);
  CMNode::getLastPos((CMNode *)pCStack_30);
  (*(pCStack_30->super_CMLeaf).super_CMNode._vptr_CMNode[2])();
  return (CMNode *)pCStack_30;
}

Assistant:

CMNode* DFAContentModel::buildSyntaxTree(ContentSpecNode* const curNode
                                         , unsigned int&        curIndex)
{
    // Initialize a return node pointer
    CMNode* retNode = 0;

    // Get the spec type of the passed node
    const ContentSpecNode::NodeTypes curType = curNode->getType();

    if ((curType & 0x0f) == ContentSpecNode::Any
        || (curType & 0x0f) == ContentSpecNode::Any_Other
        || (curType & 0x0f) == ContentSpecNode::Any_NS)
    {
        retNode = new (fMemoryManager) CMAny
        (
            curType
            , curNode->getElement()->getURI()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafList[curIndex] = new (fMemoryManager) CMLeaf
        (
            new (fMemoryManager) QName
            (
                XMLUni::fgZeroLenString
                , XMLUni::fgZeroLenString
                , curNode->getElement()->getURI()
                , fMemoryManager
            )
            , curIndex
            , true
            , fLeafCount
            , fMemoryManager
        );
        fLeafListType[curIndex] = curType;
        ++curIndex;
    }
    else if (curType == ContentSpecNode::Leaf)
    {
        //
        //  Create a new leaf node, and pass it the current leaf count, which
        //  is its DFA state position. Bump the leaf count after storing it.
        //  This makes the positions zero based since we store first and then
        //  increment.
        //
        retNode = new (fMemoryManager) CMLeaf
        (
            curNode->getElement()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        try
        {
            fLeafList[curIndex] = new (fMemoryManager) CMLeaf
            (
                curNode->getElement()
                , curIndex
                , fLeafCount
                , fMemoryManager
            );
        }
        catch( const OutOfMemoryException& )
        {
            delete retNode;
            throw;
        }
        fLeafListType[curIndex] = ContentSpecNode::Leaf;
        ++curIndex;
    }
    else if (curType == ContentSpecNode::Loop)
    {
        //
        //  Create a new leaf node, and pass it the current leaf count, which
        //  is its DFA state position. Bump the leaf count after storing it.
        //  This makes the positions zero based since we store first and then
        //  increment.
        //
        retNode = new (fMemoryManager) CMRepeatingLeaf
        (
            curNode->getFirst()->getElement()
            , curNode->getMinOccurs()
            , curNode->getMaxOccurs()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafList[curIndex] = new (fMemoryManager) CMRepeatingLeaf
        (
            curNode->getFirst()->getElement()
            , curNode->getMinOccurs()
            , curNode->getMaxOccurs()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafListType[curIndex] = curNode->getFirst()->getType();
        ++curIndex;
    }
     else
    {
        //
        //  Its not a leaf, so we have to recurse its left and maybe right
        //  nodes. Save both values before we recurse and trash the node.
        //
        ContentSpecNode* leftNode = curNode->getFirst();
        ContentSpecNode* rightNode = curNode->getSecond();

        // Detect if we have a deep tree that can be analyzed using a loop instead of recursion
        unsigned int nLoopCount=0;
        ContentSpecNode* cursor=curNode;
        while(cursor->getType()==ContentSpecNode::Sequence && cursor->getFirst() && cursor->getFirst()->getSecond()==rightNode)
        {
            nLoopCount++;
            cursor=cursor->getFirst();
        }
        if(nLoopCount!=0)
        {
            retNode = buildSyntaxTree(cursor, curIndex);
            for(unsigned int i=0;i<nLoopCount;i++)
            {
                CMNode* newRight = nullptr;
                try
                {
                    newRight = buildSyntaxTree(rightNode, curIndex);

                    //
                    //  Now handle our level. We use our left child's last pos set and our
                    //  right child's first pos set, so get them now for convenience.
                    //
                    const CMStateSet& last  = retNode->getLastPos();
                    const CMStateSet& first = newRight->getFirstPos();

                    //
                    //  Now, for every position which is in our left child's last set
                    //  add all of the states in our right child's first set to the
                    //  follow set for that position.
                    //
                    CMStateSetEnumerator enumLast(&last);
                    while(enumLast.hasMoreElements())
                    {
                        XMLSize_t index=enumLast.nextElement();
                        *fFollowList[index] |= first;
                    }

                    retNode = new (fMemoryManager) CMBinaryOp
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , newRight
                        , fLeafCount
                        , fMemoryManager
                    );
                }
                catch( const OutOfMemoryException& )
                {
                    delete newRight;
                    delete retNode;
                    throw;
                }
            }
            return retNode;
        }

        if (((curType & 0x0f) == ContentSpecNode::Choice)
        ||   ((curType & 0x0f) == ContentSpecNode::Sequence))
        {
            //
            //  Recurse on both children, and return a binary op node with the
            //  two created sub nodes as its children. The node type is the
            //  same type as the source.
            //
            CMNode* newLeft = buildSyntaxTree(leftNode, curIndex);
            CMNode* newRight;
            try
            {
                newRight = buildSyntaxTree(rightNode, curIndex);
            }
            catch( const OutOfMemoryException& )
            {
                delete newLeft;
                throw;
            }
            if(((curType & 0x0f) == ContentSpecNode::Sequence))
            {
                //
                //  Now handle our level. We use our left child's last pos set and our
                //  right child's first pos set, so get them now for convenience.
                //
                const CMStateSet& last  = newLeft->getLastPos();
                const CMStateSet& first = newRight->getFirstPos();

                //
                //  Now, for every position which is in our left child's last set
                //  add all of the states in our right child's first set to the
                //  follow set for that position.
                //
                CMStateSetEnumerator enumLast(&last);
                while(enumLast.hasMoreElements())
                {
                    XMLSize_t index=enumLast.nextElement();
                    *fFollowList[index] |= first;
                }
            }
            try
            {
                retNode = new (fMemoryManager) CMBinaryOp
                (
                    curType
                    , newLeft
                    , newRight
                    , fLeafCount
                    , fMemoryManager
                );
            }
            catch( const OutOfMemoryException& )
            {
                delete newLeft;
                delete newRight;
                throw;
            }
        }
         else if (curType == ContentSpecNode::ZeroOrMore
               || curType == ContentSpecNode::ZeroOrOne
               || curType == ContentSpecNode::OneOrMore)
        {
            CMNode* newChild = buildSyntaxTree(leftNode, curIndex);
            if (curType == ContentSpecNode::ZeroOrMore
               || curType == ContentSpecNode::OneOrMore)
            {
                //
                //  Now handle our level. We use our own first and last position
                //  sets, so get them up front.
                //
                const CMStateSet& first = newChild->getFirstPos();
                const CMStateSet& last  = newChild->getLastPos();

                //
                //  For every position which is in our last position set, add all
                //  of our first position states to the follow set for that
                //  position.
                //
                CMStateSetEnumerator enumLast(&last);
                while(enumLast.hasMoreElements())
                {
                    XMLSize_t index=enumLast.nextElement();
                    *fFollowList[index] |= first;
                }
            }
            // This one is fine as is, just change to our form
            retNode = new (fMemoryManager) CMUnaryOp
            (
                curType
                , newChild
                , fLeafCount
                , fMemoryManager
            );
        }
         else
        {
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
        }
    }
    // fault in the first and last pos, then delete it children
    try
    {
        retNode->getFirstPos();
        retNode->getLastPos();
        retNode->orphanChild();
    }
    catch( const OutOfMemoryException& )
    {
        delete retNode;
        throw;
    }
    return retNode;
}